

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::Call(SQVM *this,SQObjectPtr *closure,SQInteger nparams,SQInteger stackbase,SQObjectPtr *outres
          ,SQBool raiseerror)

{
  int iVar1;
  SQChar *pSVar2;
  SQUnsignedInteger in_RCX;
  SQObjectPtr *in_RDX;
  SQVM *in_RSI;
  SQVM *in_RDI;
  SQObjectPtr *in_R8;
  SQVM *in_R9;
  SQObjectType ctype;
  SQObjectPtr temp;
  SQObjectPtr constr;
  bool dummy;
  SQBool in_stack_00000358;
  SQObjectPtr *in_stack_00000360;
  SQInteger in_stack_00000368;
  SQInteger in_stack_00000370;
  SQObjectPtr *in_stack_00000378;
  SQVM *in_stack_00000380;
  ExecutionType in_stack_000003a0;
  SQObjectPtr *in_stack_ffffffffffffff58;
  SQObjectPtr *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  SQVM *in_stack_ffffffffffffff70;
  SQInt32 in_stack_ffffffffffffffa4;
  SQObjectValue in_stack_ffffffffffffffa8;
  SQObjectType in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  SQObjectValue in_stack_ffffffffffffffb8;
  SQNativeClosure *in_stack_ffffffffffffffc0;
  SQObjectPtr *stackbase_00;
  bool local_1;
  
  iVar1 = *(int *)&(in_RSI->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted;
  if (iVar1 == 0x8000100) {
    local_1 = Execute(in_stack_00000380,in_stack_00000378,in_stack_00000370,in_stack_00000368,
                      in_stack_00000360,in_stack_00000358,in_stack_000003a0);
  }
  else if (iVar1 == 0x8000200) {
    local_1 = CallNative(in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8.nInteger,
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (SQObjectPtr *)in_stack_ffffffffffffffa8.pTable,in_stack_ffffffffffffffa4,
                         (bool *)in_RDX,(bool *)in_RSI);
  }
  else if (iVar1 == 0x8004000) {
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffb0);
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffa0);
    CreateClassInstance(in_stack_ffffffffffffff70,
                        (SQClass *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                        in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if ((in_stack_ffffffffffffffb0 == OT_NATIVECLOSURE) || (in_stack_ffffffffffffffb0 == OT_CLOSURE)
       ) {
      stackbase_00 = in_R8;
      sqvector<SQObjectPtr>::operator[](&in_RDI->_stack,in_RCX);
      ::SQObjectPtr::operator=
                (in_R8,(SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68))
      ;
      local_1 = Call(in_RSI,in_RDX,in_RCX,(SQInteger)stackbase_00,(SQObjectPtr *)in_R9,
                     (SQBool)in_stack_ffffffffffffffc0);
    }
    else {
      local_1 = true;
    }
    ::SQObjectPtr::~SQObjectPtr(in_stack_ffffffffffffff60);
    ::SQObjectPtr::~SQObjectPtr(in_stack_ffffffffffffff60);
  }
  else {
    pSVar2 = GetTypeName((SQObjectPtr *)0x131cb5);
    Raise_Error(in_RDI,"attempt to call \'%s\'",pSVar2);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SQVM::Call(SQObjectPtr &closure,SQInteger nparams,SQInteger stackbase,SQObjectPtr &outres,SQBool raiseerror)
{
#ifdef _DEBUG
SQInteger prevstackbase = _stackbase;
#endif
    switch(sq_type(closure)) {
    case OT_CLOSURE:
        return Execute(closure, nparams, stackbase, outres, raiseerror);
        break;
    case OT_NATIVECLOSURE:{
        bool dummy;
        return CallNative(_nativeclosure(closure), nparams, stackbase, outres, -1, dummy, dummy);

                          }
        break;
    case OT_CLASS: {
        SQObjectPtr constr;
        SQObjectPtr temp;
        CreateClassInstance(_class(closure),outres,constr);
        SQObjectType ctype = sq_type(constr);
        if (ctype == OT_NATIVECLOSURE || ctype == OT_CLOSURE) {
            _stack[stackbase] = outres;
            return Call(constr,nparams,stackbase,temp,raiseerror);
        }
        return true;
                   }
        break;
    default:
        Raise_Error(_SC("attempt to call '%s'"), GetTypeName(closure));
        return false;
    }
#ifdef _DEBUG
    if(!_suspended) {
        assert(_stackbase == prevstackbase);
    }
#endif
    return true;
}